

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O1

void __thiscall capnp::_::PackedInputStream::skip(PackedInputStream *this,size_t bytes)

{
  ArrayPtr<const_unsigned_char> AVar1;
  int iVar2;
  byte bVar4;
  uchar *puVar5;
  uint uVar6;
  uchar *puVar7;
  byte *pbVar8;
  byte *pbVar9;
  size_t sVar10;
  bool bVar11;
  ArrayPtr<const_unsigned_char> AVar12;
  ArrayPtr<const_unsigned_char> AVar13;
  uchar *puVar3;
  
  if (bytes != 0) {
    AVar12 = kj::BufferedInputStream::getReadBuffer(this->inner);
    puVar3 = AVar12.ptr;
    do {
      sVar10 = AVar12.size_;
      pbVar8 = AVar12.ptr;
      if ((ulong)((long)(puVar3 + sVar10) - (long)pbVar8) < 10) {
        if (puVar3 + sVar10 == pbVar8) {
          (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,sVar10);
          AVar12 = kj::BufferedInputStream::getReadBuffer(this->inner);
          puVar3 = AVar12.ptr;
          iVar2 = 5;
          if (AVar12.size_ == 0) {
            skip();
LAB_0028bb14:
            puVar3 = AVar12.ptr;
            AVar12.size_ = AVar12.size_;
            AVar12.ptr = pbVar8;
            iVar2 = 1;
          }
        }
        else {
          bVar4 = *pbVar8;
          pbVar8 = pbVar8 + 1;
          bVar11 = false;
          uVar6 = 0;
          do {
            AVar13.size_ = sVar10;
            AVar13.ptr = pbVar8;
            if ((bVar4 >> (uVar6 & 0x1f) & 1) != 0) {
              if (puVar3 + sVar10 == pbVar8) {
                (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,sVar10);
                AVar13 = kj::BufferedInputStream::getReadBuffer(this->inner);
                puVar3 = AVar13.ptr;
                if (AVar13.size_ == 0) {
                  skip();
                  iVar2 = 1;
                  goto LAB_0028b925;
                }
              }
              sVar10 = AVar13.size_;
              pbVar8 = AVar13.ptr + 1;
            }
            AVar13.size_ = sVar10;
            AVar13.ptr = puVar3;
            bVar11 = 6 < uVar6;
            uVar6 = uVar6 + 1;
          } while (uVar6 != 8);
          iVar2 = 9;
LAB_0028b925:
          sVar10 = AVar13.size_;
          puVar3 = AVar13.ptr;
          AVar12.size_ = sVar10;
          AVar12.ptr = pbVar8;
          AVar1.size_ = sVar10;
          AVar1.ptr = pbVar8;
          if (bVar11) {
            if ((puVar3 + sVar10 == pbVar8) && (AVar12 = AVar1, (byte)(bVar4 + 1) < 2)) {
              (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,sVar10);
              AVar12 = kj::BufferedInputStream::getReadBuffer(this->inner);
              puVar3 = AVar12.ptr;
              if (AVar12.size_ == 0) {
                skip();
                bytes = (size_t)(bytes + -8);
                goto LAB_0028bb14;
              }
            }
            goto LAB_0028b9ca;
          }
        }
      }
      else {
        bVar4 = *pbVar8;
        AVar12.size_ = sVar10;
        AVar12.ptr = pbVar8 + (ulong)(bVar4 >> 7) +
                              (ulong)((bVar4 >> 6 & 1) != 0) +
                              (ulong)(bVar4 >> 5 & 1) +
                              (ulong)((bVar4 >> 4 & 1) != 0) +
                              (ulong)(bVar4 >> 3 & 1) +
                              (ulong)((bVar4 >> 2 & 1) != 0) +
                              (ulong)(bVar4 >> 1 & 1) + (ulong)(bVar4 & 1) + 1;
LAB_0028b9ca:
        puVar7 = (uchar *)(bytes + -8);
        sVar10 = AVar12.size_;
        pbVar8 = AVar12.ptr;
        if (bVar4 == 0xff) {
          pbVar9 = pbVar8 + 1;
          AVar12.size_ = sVar10;
          AVar12.ptr = pbVar9;
          puVar5 = (uchar *)((ulong)*pbVar8 * 8);
          bytes = (size_t)(puVar7 + (ulong)*pbVar8 * -8);
          if (puVar7 < puVar5) {
            skip();
            iVar2 = 1;
            bVar11 = false;
            bytes = (size_t)puVar7;
          }
          else if (puVar5 < puVar3 + (sVar10 - (long)pbVar9)) {
            AVar12.ptr = pbVar9 + (long)puVar5;
            iVar2 = 0;
            bVar11 = true;
          }
          else {
            (*(this->inner->super_InputStream)._vptr_InputStream[3])
                      (this->inner,
                       (uint)((int)puVar5 - (int)(puVar3 + (sVar10 - (long)pbVar9))) + sVar10);
            if ((uchar *)bytes == (uchar *)0x0) {
              iVar2 = 1;
              bVar11 = false;
            }
            else {
              AVar12 = kj::BufferedInputStream::getReadBuffer(this->inner);
              puVar3 = AVar12.ptr;
              iVar2 = 5;
              bVar11 = false;
            }
          }
          if (!bVar11) goto LAB_0028bac2;
        }
        else {
          bytes = (size_t)puVar7;
          if (bVar4 == 0) {
            puVar5 = (uchar *)((ulong)*pbVar8 * 8);
            bytes = (size_t)(puVar7 + (ulong)*pbVar8 * -8);
            if (puVar7 < puVar5) {
              skip();
              bytes = (size_t)puVar7;
            }
            AVar12.size_ = sVar10;
            AVar12.ptr = pbVar8 + 1;
            iVar2 = 1;
            if (puVar7 < puVar5) goto LAB_0028bac2;
          }
        }
        iVar2 = 0;
        if ((uchar *)bytes == (uchar *)0x0) {
          (*(this->inner->super_InputStream)._vptr_InputStream[3])
                    (this->inner,(long)AVar12.ptr - (long)puVar3);
          iVar2 = 1;
          bytes = 0;
        }
      }
LAB_0028bac2:
    } while ((iVar2 == 0) || (iVar2 == 5));
  }
  return;
}

Assistant:

void PackedInputStream::skip(size_t bytes) {
  // We can't just read into buffers because buffers must end on block boundaries.

  if (bytes == 0) {
    return;
  }

  KJ_DREQUIRE(bytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  kj::ArrayPtr<const byte> buffer = inner.getReadBuffer();
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { return; } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

  for (;;) {
    uint8_t tag;

    if (BUFFER_REMAINING < 10) {
      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          in++;
        }
      }
      bytes -= 8;

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      in += (tag & (1u << n)) != 0

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE

      bytes -= 8;
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining > runLength) {
        // Fast path.
        in += runLength;
      } else {
        // Forward skip to the underlying stream.
        runLength -= inRemaining;
        inner.skip(buffer.size() + runLength);

        if (bytes == 0) {
          return;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (bytes == 0) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
}